

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numeric.cpp
# Opt level: O2

void duckdb::RoundDecimalOperator::Operation<duckdb::hugeint_t,duckdb::Hugeint>
               (DataChunk *input,uint8_t scale,Vector *result)

{
  reference this;
  undefined7 in_register_00000031;
  anon_class_16_2_0b9647cc fun;
  FunctionErrors errors;
  hugeint_t local_40;
  hugeint_t addition;
  
  errors = (FunctionErrors)
           *(undefined8 *)
            (Hugeint::POWERS_OF_TEN + (uint)((int)CONCAT71(in_register_00000031,scale) << 4));
  hugeint_t::hugeint_t(&local_40,2);
  addition = hugeint_t::operator/((hugeint_t *)&stack0xffffffffffffffa8,&local_40);
  this = vector<duckdb::Vector,_true>::get<true>(&input->data,0);
  fun.power_of_ten = (hugeint_t *)0x1;
  fun.addition = (hugeint_t *)&stack0xffffffffffffffa8;
  UnaryExecutor::
  Execute<duckdb::hugeint_t,duckdb::hugeint_t,duckdb::RoundDecimalOperator::Operation<duckdb::hugeint_t,duckdb::Hugeint>(duckdb::DataChunk&,unsigned_char,duckdb::Vector&)::_lambda(duckdb::hugeint_t)_1_>
            ((UnaryExecutor *)this,result,(Vector *)input->count,(idx_t)&addition,fun,errors);
  return;
}

Assistant:

static void Operation(DataChunk &input, uint8_t scale, Vector &result) {
		T power_of_ten = UnsafeNumericCast<T>(POWERS_OF_TEN_CLASS::POWERS_OF_TEN[scale]);
		T addition = power_of_ten / 2;
		// regular round rounds towards the nearest number
		// in case of a tie we round away from zero
		// i.e. -10.5 -> -11, 10.5 -> 11
		// we implement this by adding (positive) or subtracting (negative) 0.5
		// and then flooring the number
		// e.g. 10.5 + 0.5 = 11, floor(11) = 11
		//      10.4 + 0.5 = 10.9, floor(10.9) = 10
		UnaryExecutor::Execute<T, T>(input.data[0], result, input.size(), [&](T input) {
			if (input < 0) {
				input -= addition;
			} else {
				input += addition;
			}
			return UnsafeNumericCast<T>(input / power_of_ten);
		});
	}